

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.hpp
# Opt level: O0

unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
 __thiscall
HawkTracer::parser::
make_unique<HawkTracer::parser::EventKlassField,char*,char_const*&,HawkTracer::parser::FieldTypeId,std::shared_ptr<HawkTracer::parser::EventKlass_const>>
          (parser *this,char **args,char **args_1,FieldTypeId *args_2,
          shared_ptr<const_HawkTracer::parser::EventKlass> *args_3)

{
  FieldTypeId type_id;
  char *pcVar1;
  EventKlassField *this_00;
  shared_ptr<const_HawkTracer::parser::EventKlass> local_a0;
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  shared_ptr<const_HawkTracer::parser::EventKlass> *local_30;
  shared_ptr<const_HawkTracer::parser::EventKlass> *args_local_3;
  FieldTypeId *args_local_2;
  char **args_local_1;
  char **args_local;
  
  local_30 = args_3;
  args_local_3 = (shared_ptr<const_HawkTracer::parser::EventKlass> *)args_2;
  args_local_2 = (FieldTypeId *)args_1;
  args_local_1 = args;
  args_local = (char **)this;
  this_00 = (EventKlassField *)operator_new(0x58);
  pcVar1 = *args_local_1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,pcVar1,&local_51);
  pcVar1 = *(char **)args_local_2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,pcVar1,&local_89);
  type_id = *(FieldTypeId *)
             &(args_local_3->
              super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
  std::shared_ptr<const_HawkTracer::parser::EventKlass>::shared_ptr(&local_a0,local_30);
  EventKlassField::EventKlassField(this_00,(string *)local_50,(string *)local_88,type_id,&local_a0);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,std::default_delete<HawkTracer::parser::EventKlassField>>
  ::unique_ptr<std::default_delete<HawkTracer::parser::EventKlassField>,void>
            ((unique_ptr<HawkTracer::parser::EventKlassField,std::default_delete<HawkTracer::parser::EventKlassField>>
              *)this,this_00);
  std::shared_ptr<const_HawkTracer::parser::EventKlass>::~shared_ptr(&local_a0);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return (__uniq_ptr_data<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>,_true,_true>
          )(__uniq_ptr_data<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args)
{
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}